

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O2

int lws_buflist_linear_copy(lws_buflist **head,size_t ofs,uint8_t *buf,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  uint8_t *__dest;
  
  __dest = buf;
  while ((uVar2 = ofs, head = &((lws_buflist *)head)->next->next,
         (lws_buflist *)head != (lws_buflist *)0x0 && (len != 0))) {
    uVar1 = ((lws_buflist *)head)->len;
    ofs = uVar2 - uVar1;
    if (uVar2 < uVar1) {
      __n = uVar1 - uVar2;
      if (len <= uVar1 - uVar2) {
        __n = len;
      }
      memcpy(__dest,(void *)((long)&((lws_buflist *)((long)head + 0x18))->pos + uVar2),__n);
      len = len - __n;
      __dest = __dest + __n;
      ofs = 0;
    }
  }
  return (int)__dest - (int)buf;
}

Assistant:

int
lws_buflist_linear_copy(struct lws_buflist **head, size_t ofs, uint8_t *buf,
			size_t len)
{
	struct lws_buflist *p = *head;
	uint8_t *obuf = buf;
	size_t s;

	while (p && len) {
		if (ofs < p->len) {
			s = p->len - ofs;
			if (s > len)
				s = len;
			memcpy(buf, ((uint8_t *)&p[1]) + LWS_PRE + ofs, s);
			len -= s;
			buf += s;
			ofs = 0;
		} else
			ofs -= p->len;
		p = p->next;
	}

	return lws_ptr_diff(buf, obuf);
}